

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O1

int SoapySDRDevice_setDCOffset
              (SoapySDRDevice *device,int direction,size_t channel,double offsetI,double offsetQ)

{
  undefined1 *puVar1;
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014ce80);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  (**(code **)(*(long *)device + 0x110))(device,direction,channel);
  return 0;
}

Assistant:

int SoapySDRDevice_setDCOffset(SoapySDRDevice *device, const int direction, const size_t channel, const double offsetI, const double offsetQ)
{
    __SOAPY_SDR_C_TRY
    device->setDCOffset(direction, channel, std::complex<double>(offsetI, offsetQ));
    __SOAPY_SDR_C_CATCH
}